

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_64ea::Main_getInstance_Test::TestBody(Main_getInstance_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Main *instance;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  Main *local_10;
  
  local_10 = Main::getInstance();
  testing::internal::CmpHelperEQ<Main*,Main*>
            (local_20,"instance","Main::instance",&local_10,&Main::instance);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Main, getInstance) {
        Main* instance = Main::getInstance();
        EXPECT_EQ(instance, Main::instance);
    }